

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O2

void __thiscall
FDrawInfo::AddUpperMissingTexture(FDrawInfo *this,side_t *side,subsector_t *sub,float Backheight)

{
  TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo> *this_00;
  TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo> *this_01;
  seg_t *psVar1;
  float *pfVar2;
  ulong uVar3;
  int i;
  long lVar4;
  MissingTextureInfo mti;
  MissingSegInfo msi;
  MissingTextureInfo local_68;
  FDrawInfo *local_48;
  MissingSegInfo local_40;
  
  if ((*side->segs)->backsector != (sector_t *)0x0) {
    this_00 = &this->MissingUpperTextures;
    this_01 = &this->MissingUpperSegs;
    for (lVar4 = 0; lVar4 < side->numsegs; lVar4 = lVar4 + 1) {
      psVar1 = side->segs[lVar4];
      if (psVar1->Subsector == sub) {
        local_68.Planez = 0.0;
        local_68.Planezfront = 0.0;
        local_68.seg = (seg_t *)0x0;
        local_68.sub = (subsector_t *)0x0;
        if (sub->render_sector != sub->sector) {
          return;
        }
        if (psVar1->frontsector != sub->render_sector) {
          return;
        }
        pfVar2 = &((this->MissingUpperTextures).Array)->Planez;
        for (uVar3 = 0; (this->MissingUpperTextures).Count != uVar3; uVar3 = uVar3 + 1) {
          if (*(subsector_t **)(pfVar2 + -2) == sub) {
            if (Backheight < *pfVar2) {
              *pfVar2 = Backheight;
              ((MissingTextureInfo *)(pfVar2 + -4))->seg = psVar1;
            }
            local_40.MTI_Index = (int)uVar3;
            local_40.seg = psVar1;
            TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::Push(this_01,&local_40);
            return;
          }
          pfVar2 = pfVar2 + 6;
        }
        local_68.Planezfront = 0.0;
        local_68.Planez = Backheight;
        local_68.seg = psVar1;
        local_68.sub = sub;
        local_48 = this;
        local_40.MTI_Index =
             TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::Push
                       (this_00,&local_68);
        local_40.seg = psVar1;
        TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::Push(this_01,&local_40);
        this = local_48;
      }
    }
  }
  return;
}

Assistant:

void FDrawInfo::AddUpperMissingTexture(side_t * side, subsector_t *sub, float Backheight)
{
	if (!side->segs[0]->backsector) return;

	totalms.Clock();
	for (int i = 0; i < side->numsegs; i++)
	{
		seg_t *seg = side->segs[i];

		// we need find the seg belonging to the passed subsector
		if (seg->Subsector == sub)
		{
			MissingTextureInfo mti = {};
			MissingSegInfo msi;


			if (sub->render_sector != sub->sector || seg->frontsector != sub->sector)
			{
				totalms.Unclock();
				return;
			}

			for (unsigned int i = 0; i < MissingUpperTextures.Size(); i++)
			{
				if (MissingUpperTextures[i].sub == sub)
				{
					// Use the lowest adjoining height to draw a fake ceiling if necessary
					if (Backheight < MissingUpperTextures[i].Planez)
					{
						MissingUpperTextures[i].Planez = Backheight;
						MissingUpperTextures[i].seg = seg;
					}

					msi.MTI_Index = i;
					msi.seg = seg;
					MissingUpperSegs.Push(msi);
					totalms.Unclock();
					return;
				}
			}
			mti.seg = seg;
			mti.sub = sub;
			mti.Planez = Backheight;
			msi.MTI_Index = MissingUpperTextures.Push(mti);
			msi.seg = seg;
			MissingUpperSegs.Push(msi);
		}
	}
	totalms.Unclock();
}